

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
::set_empty_key(dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                *this,key_type *key)

{
  pointer piVar1;
  float *in_RSI;
  sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *in_RDI;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *unaff_retaddr;
  sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *table_start;
  
  table_start = in_RDI;
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::set_use_empty
            (in_RDI,true);
  in_RDI[1].enlarge_factor_ = *in_RSI;
  piVar1 = Alloc<int,_unsigned_char,_(unsigned_char)'\n'>::allocate
                     ((Alloc<int,_unsigned_char,_(unsigned_char)__n_> *)unaff_retaddr,
                      (size_type_conflict)((ulong)table_start >> 0x38),(const_pointer)in_RSI);
  *(pointer *)&in_RDI[2].super_Hasher.num_compares_ = piVar1;
  fill_range_with_empty(unaff_retaddr,(pointer)table_start,(size_type)((ulong)in_RSI >> 0x38));
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }